

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

BrandedDecl *
kj::_::
CopyConstructArray_<capnp::compiler::NodeTranslator::BrandedDecl,_capnp::compiler::NodeTranslator::BrandedDecl_*,_false,_false>
::apply(BrandedDecl *pos,BrandedDecl *start,BrandedDecl *end)

{
  ExceptionGuard local_30;
  
  local_30.start = pos;
  for (; local_30.pos = pos, start != end; start = start + 1) {
    capnp::compiler::NodeTranslator::BrandedDecl::BrandedDecl(pos,start);
    pos = local_30.pos + 1;
  }
  local_30.start = pos;
  ExceptionGuard::~ExceptionGuard(&local_30);
  return pos;
}

Assistant:

static T* apply(T* __restrict__ pos, Iterator start, Iterator end) {
    // Verify that T can be *implicitly* constructed from the source values.
    if (false) implicitCast<T>(*start);

    if (noexcept(T(*start))) {
      while (start != end) {
        ctor(*pos++, *start++);
      }
      return pos;
    } else {
      // Crap.  This is complicated.
      ExceptionGuard guard(pos);
      while (start != end) {
        ctor(*guard.pos, *start++);
        ++guard.pos;
      }
      guard.start = guard.pos;
      return guard.pos;
    }
  }